

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpo.c
# Opt level: O0

Literal_t * Rpo_Factorize(uint *target,int nVars,int nThreshold,int verbose)

{
  int iVar1;
  int local_4c;
  Literal_t *pLStack_48;
  int thresholdCount;
  Literal_t *result;
  Literal_t *lit;
  Literal_t **vecLit;
  int w;
  int nLit;
  int nLitCap;
  int verbose_local;
  int nThreshold_local;
  int nVars_local;
  uint *target_local;
  
  w = nVars << 1;
  vecLit._4_4_ = 0;
  local_4c = 0;
  nLit = verbose;
  nLitCap = nThreshold;
  verbose_local = nVars;
  _nThreshold_local = target;
  iVar1 = Kit_TruthIsConst0(target,nVars);
  if (iVar1 == 0) {
    iVar1 = Kit_TruthIsConst1(_nThreshold_local,verbose_local);
    if (iVar1 == 0) {
      if (nLit != 0) {
        Abc_Print(-2,"Target: ");
        Lit_PrintTT(_nThreshold_local,verbose_local);
        Abc_Print(-2,"\n");
      }
      lit = (Literal_t *)malloc((long)w << 3);
      vecLit._0_4_ = verbose_local;
      while (vecLit._0_4_ = (int)vecLit + -1, -1 < (int)vecLit) {
        result = Lit_Alloc(_nThreshold_local,verbose_local,(int)vecLit,'+');
        if (result != (Literal_t *)0x0) {
          (&lit->transition)[(int)vecLit._4_4_] = (uint *)result;
          vecLit._4_4_ = vecLit._4_4_ + 1;
        }
        result = Lit_Alloc(_nThreshold_local,verbose_local,(int)vecLit,'-');
        if (result != (Literal_t *)0x0) {
          (&lit->transition)[(int)vecLit._4_4_] = (uint *)result;
          vecLit._4_4_ = vecLit._4_4_ + 1;
        }
      }
      if (nLit != 0) {
        Abc_Print(-2,"Allocated %d literal clusters\n",(ulong)vecLit._4_4_);
      }
      pLStack_48 = Rpo_Recursion(_nThreshold_local,(Literal_t **)lit,vecLit._4_4_,vecLit._4_4_,
                                 verbose_local,&local_4c,nLitCap,nLit);
      for (vecLit._0_4_ = 0; (int)vecLit < (int)vecLit._4_4_; vecLit._0_4_ = (int)vecLit + 1) {
        Lit_Free((Literal_t *)(&lit->transition)[(int)vecLit]);
      }
      if (lit != (Literal_t *)0x0) {
        free(lit);
      }
      target_local = (uint *)pLStack_48;
    }
    else {
      target_local = (uint *)Lit_CreateLiteralConst(_nThreshold_local,verbose_local,1);
    }
  }
  else {
    target_local = (uint *)Lit_CreateLiteralConst(_nThreshold_local,verbose_local,0);
  }
  return (Literal_t *)target_local;
}

Assistant:

Literal_t* Rpo_Factorize(unsigned* target, int nVars, int nThreshold, int verbose) {

    int nLitCap = nVars * 2;
    int nLit = 0;
    int w;
    Literal_t** vecLit;
    Literal_t* lit;
    Literal_t* result;
    int thresholdCount = 0;

    if (Kit_TruthIsConst0(target, nVars)) {
        return Lit_CreateLiteralConst(target, nVars, 0);
    } else if (Kit_TruthIsConst1(target, nVars)) {
        return Lit_CreateLiteralConst(target, nVars, 1);
    }

    //    if (nThreshold == -1) {
    //        nThreshold = nLitCap + nVars;
    //    }
    if (verbose) {
        Abc_Print(-2, "Target: ");
        Lit_PrintTT(target, nVars);
        Abc_Print(-2, "\n");
    }
    vecLit = ABC_ALLOC(Literal_t*, nLitCap);

    for (w = nVars - 1; w >= 0; w--) {
        lit = Lit_Alloc(target, nVars, w, '+');
        if (lit != NULL) {
            vecLit[nLit] = lit;
            nLit++;
        }
        lit = Lit_Alloc(target, nVars, w, '-');
        if (lit != NULL) {
            vecLit[nLit] = lit;
            nLit++;
        }
    }
    if (verbose) {
        Abc_Print(-2, "Allocated %d literal clusters\n", nLit);
    }

    result = Rpo_Recursion(target, vecLit, nLit, nLit, nVars, &thresholdCount, nThreshold, verbose);

    //freeing the memory
    for (w = 0; w < nLit; ++w) {
        Lit_Free(vecLit[w]);
    }
    ABC_FREE(vecLit);

    return result;

}